

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O0

bool cfgfile::format_t<bool,_cfgfile::string_trait_t>::from_string
               (parser_info_t<cfgfile::string_trait_t> *info,string_t *value)

{
  __type _Var1;
  undefined8 uVar2;
  parser_info_t<cfgfile::string_trait_t> *in_RDI;
  string *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  string_t *what;
  exception_t<cfgfile::string_trait_t> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  string_t local_1b9 [2];
  exception_t<cfgfile::string_trait_t> local_171 [7];
  parser_info_t<cfgfile::string_trait_t> *local_10;
  
  local_10 = in_RDI;
  _Var1 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  if ((((!_Var1) &&
       (_Var1 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8), !_Var1)) &&
      (_Var1 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8), !_Var1)) &&
     (_Var1 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8), !_Var1)) {
    _Var1 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    if (((!_Var1) &&
        (_Var1 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8), !_Var1)) &&
       ((_Var1 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8), !_Var1 &&
        (_Var1 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8), !_Var1)))) {
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,
                 (allocator<char> *)in_stack_fffffffffffffde0);
      string_trait_t::from_ascii(in_stack_fffffffffffffda8);
      std::operator+(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      this = local_171;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,
                 (allocator<char> *)in_stack_fffffffffffffde0);
      string_trait_t::from_ascii(in_stack_fffffffffffffda8);
      std::operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
      std::operator+(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      what = local_1b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,
                 (allocator<char> *)in_stack_fffffffffffffde0);
      string_trait_t::from_ascii(in_stack_fffffffffffffda8);
      std::operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
      string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffda8);
      std::operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,
                 (allocator<char> *)in_stack_fffffffffffffde0);
      string_trait_t::from_ascii(in_stack_fffffffffffffda8);
      std::operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      exception_t<cfgfile::string_trait_t>::exception_t(this,what);
      __cxa_throw(uVar2,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
    return false;
  }
  return true;
}

Assistant:

static bool from_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & value )
	{
		if( value == const_t< Trait >::c_on ||
			value == const_t< Trait >::c_true ||
			value == const_t< Trait >::c_1 ||
			value == const_t< Trait >::c_yes )
				return true;
		else if( value == const_t< Trait >::c_off ||
			value == const_t< Trait >::c_false ||
			value == const_t< Trait >::c_0 ||
			value == const_t< Trait >::c_no )
				return false;
		else
			throw exception_t< Trait >(
				Trait::from_ascii( "Invalid value: \"" ) +
				value + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );
	}